

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::safe_strtou32(string *str,uint32 *value)

{
  bool bVar1;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)str);
  bVar1 = safe_uint_internal<unsigned_int>(&local_30,value);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool safe_strtou32(const string& str, uint32* value) {
  return safe_uint_internal(str, value);
}